

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfIDManifest.cpp
# Opt level: O0

ChannelGroupManifest * __thiscall Imf_3_2::IDManifest::add(IDManifest *this,string *channel)

{
  reference __x;
  value_type *in_RDI;
  ChannelGroupManifest *mfst;
  ChannelGroupManifest *this_00;
  ChannelGroupManifest *in_stack_ffffffffffffff10;
  ChannelGroupManifest local_e0;
  
  this_00 = &local_e0;
  ChannelGroupManifest::ChannelGroupManifest(in_stack_ffffffffffffff10);
  std::
  vector<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
  ::push_back((vector<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
               *)this_00,in_RDI);
  ChannelGroupManifest::~ChannelGroupManifest(this_00);
  __x = std::
        vector<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
        ::back((vector<Imf_3_2::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_2::IDManifest::ChannelGroupManifest>_>
                *)this_00);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::insert(&in_stack_ffffffffffffff10->_channels,(value_type *)__x);
  return __x;
}

Assistant:

IDManifest::ChannelGroupManifest&
IDManifest::add (const string& channel)
{
    _manifest.push_back (ChannelGroupManifest ());
    ChannelGroupManifest& mfst = _manifest.back ();
    mfst._channels.insert (channel);
    return mfst;
}